

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QList<QToolBar_*> *
findChildrenHelper<QToolBar*>(QList<QToolBar_*> *__return_storage_ptr__,QObject *o)

{
  QToolBar *pQVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QToolBar *local_38;
  QList<QToolBar_*> *local_30;
  
  local_30 = *(QList<QToolBar_*> **)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QToolBar **)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(long *)(o + 0x28) != 0) {
    uVar2 = 0;
    do {
      pQVar1 = (QToolBar *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
      if (pQVar1 != (QToolBar *)0x0) {
        local_38 = pQVar1;
        QtPrivate::QPodArrayOps<QToolBar*>::emplace<QToolBar*&>
                  ((QPodArrayOps<QToolBar*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_38);
        QList<QToolBar_*>::end(__return_storage_ptr__);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(ulong *)(o + 0x28));
  }
  if (*(QList<QToolBar_*> **)(in_FS_OFFSET + 0x28) == local_30) {
    return *(QList<QToolBar_*> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static QList<T> findChildrenHelper(const QObject *o)
{
    const QObjectList &list = o->children();
    QList<T> result;

    for (int i=0; i < list.size(); ++i) {
        if (T t = qobject_cast<T>(list[i])) {
            result.append(t);
        }
    }

    return result;
}